

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

reverse_iterator * __thiscall
llvm::sys::path::rend(reverse_iterator *__return_storage_ptr__,path *this,StringRef Path)

{
  (__return_storage_ptr__->Path).Data = (char *)this;
  (__return_storage_ptr__->Path).Length = (size_t)Path.Data;
  (__return_storage_ptr__->Component).Data = (char *)this;
  (__return_storage_ptr__->Component).Length = 0;
  __return_storage_ptr__->Position = 0;
  return __return_storage_ptr__;
}

Assistant:

reverse_iterator rend(StringRef Path) {
  reverse_iterator I;
  I.Path = Path;
  I.Component = Path.substr(0, 0);
  I.Position = 0;
  return I;
}